

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512-sw.c
# Opt level: O0

void sha512_sw_block(uint64_t *core,uint8_t *block)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint local_2ec;
  uint64_t uStack_2e8;
  int t;
  uint64_t h;
  uint64_t g;
  uint64_t f;
  uint64_t e;
  uint64_t d;
  uint64_t c;
  uint64_t b;
  uint64_t a;
  uint64_t w [80];
  uint8_t *block_local;
  uint64_t *core_local;
  
  for (local_2ec = 0; (int)local_2ec < 0x10; local_2ec = local_2ec + 1) {
    uVar2 = GET_64BIT_MSB_FIRST(block + (int)(local_2ec << 3));
    w[(long)(int)local_2ec + -1] = uVar2;
  }
  for (local_2ec = 0x10; (int)local_2ec < 0x50; local_2ec = local_2ec + 1) {
    uVar2 = w[(long)(int)(local_2ec + -0x10) + -1];
    uVar1 = w[(long)(int)(local_2ec + -7) + -1];
    uVar3 = sigma_0(w[(long)(int)(local_2ec + -0xf) + -1]);
    uVar4 = sigma_1(w[(long)(int)(local_2ec + -2) + -1]);
    w[(long)(int)local_2ec + -1] = uVar2 + uVar1 + uVar3 + uVar4;
  }
  b = *core;
  c = core[1];
  d = core[2];
  e = core[3];
  f = core[4];
  g = core[5];
  h = core[6];
  uStack_2e8 = core[7];
  for (local_2ec = 0; (int)local_2ec < 0x50; local_2ec = local_2ec + 8) {
    sha512_sw_round(local_2ec,&a,&b,&c,&d,&e,&f,&g,&h,&stack0xfffffffffffffd18);
    sha512_sw_round(local_2ec + 1,&a,&stack0xfffffffffffffd18,&b,&c,&d,&e,&f,&g,&h);
    sha512_sw_round(local_2ec + 2,&a,&h,&stack0xfffffffffffffd18,&b,&c,&d,&e,&f,&g);
    sha512_sw_round(local_2ec + 3,&a,&g,&h,&stack0xfffffffffffffd18,&b,&c,&d,&e,&f);
    sha512_sw_round(local_2ec + 4,&a,&f,&g,&h,&stack0xfffffffffffffd18,&b,&c,&d,&e);
    sha512_sw_round(local_2ec + 5,&a,&e,&f,&g,&h,&stack0xfffffffffffffd18,&b,&c,&d);
    sha512_sw_round(local_2ec + 6,&a,&d,&e,&f,&g,&h,&stack0xfffffffffffffd18,&b,&c);
    sha512_sw_round(local_2ec + 7,&a,&c,&d,&e,&f,&g,&h,&stack0xfffffffffffffd18,&b);
  }
  *core = b + *core;
  core[1] = c + core[1];
  core[2] = d + core[2];
  core[3] = e + core[3];
  core[4] = f + core[4];
  core[5] = g + core[5];
  core[6] = h + core[6];
  core[7] = uStack_2e8 + core[7];
  smemclr(&a,0x280);
  return;
}

Assistant:

static void sha512_sw_block(uint64_t *core, const uint8_t *block)
{
    uint64_t w[SHA512_ROUNDS];
    uint64_t a,b,c,d,e,f,g,h;

    int t;

    for (t = 0; t < 16; t++)
        w[t] = GET_64BIT_MSB_FIRST(block + 8*t);

    for (t = 16; t < SHA512_ROUNDS; t++)
        w[t] = w[t-16] + w[t-7] + sigma_0(w[t-15]) + sigma_1(w[t-2]);

    a = core[0]; b = core[1]; c = core[2]; d = core[3];
    e = core[4]; f = core[5]; g = core[6]; h = core[7];

    for (t = 0; t < SHA512_ROUNDS; t+=8) {
        sha512_sw_round(t+0, w, &a,&b,&c,&d,&e,&f,&g,&h);
        sha512_sw_round(t+1, w, &h,&a,&b,&c,&d,&e,&f,&g);
        sha512_sw_round(t+2, w, &g,&h,&a,&b,&c,&d,&e,&f);
        sha512_sw_round(t+3, w, &f,&g,&h,&a,&b,&c,&d,&e);
        sha512_sw_round(t+4, w, &e,&f,&g,&h,&a,&b,&c,&d);
        sha512_sw_round(t+5, w, &d,&e,&f,&g,&h,&a,&b,&c);
        sha512_sw_round(t+6, w, &c,&d,&e,&f,&g,&h,&a,&b);
        sha512_sw_round(t+7, w, &b,&c,&d,&e,&f,&g,&h,&a);
    }

    core[0] += a; core[1] += b; core[2] += c; core[3] += d;
    core[4] += e; core[5] += f; core[6] += g; core[7] += h;

    smemclr(w, sizeof(w));
}